

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O3

WJTL_STATUS
VerifyJsonParsesAsListOfDictionariesOfNumbers
          (_Bool IsJson5,char *Json,uint32_t ListCount,uint32_t DictionaryCount)

{
  JlDataObject *pJVar1;
  size_t sVar2;
  JL_STATUS JVar3;
  JL_DATA_TYPE JVar4;
  uint32_t uVar5;
  JL_STATUS JVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint32_t uVar10;
  WJTL_STATUS WVar11;
  JlDataObject *dictionaryObject;
  JlDataObject *object;
  JlDataObject *listObject;
  uint64_t u64;
  size_t errorAtPos;
  char keyName [32];
  JlDataObject *local_b0;
  uint32_t local_a8;
  uint32_t local_a4;
  JlDataObject *local_a0;
  JlDataObject *local_98;
  uint32_t local_8c;
  ulong local_88;
  uint64_t local_80;
  JlListItem *local_78;
  ulong local_70;
  ulong local_68;
  size_t local_60;
  char local_58 [40];
  
  local_98 = (JlDataObject *)0x0;
  local_60 = 100;
  local_b0 = (JlDataObject *)0x0;
  local_a8 = DictionaryCount;
  local_a4 = ListCount;
  JVar3 = JlParseJsonEx(Json,IsJson5,&local_98,&local_60);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2f9);
  pJVar1 = local_98;
  WjTestLib_Assert(local_98 != (JlDataObject *)0x0,"(listObject) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fa);
  JVar4 = JlGetObjectType(local_98);
  WjTestLib_Assert(JVar4 == JL_DATA_TYPE_LIST,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fb);
  sVar2 = local_60;
  WjTestLib_Assert(local_60 == 0,"errorAtPos == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fc);
  uVar5 = JlGetListCount(local_98);
  uVar10 = local_a4;
  WVar11 = WJTL_STATUS_FAILED;
  if (uVar5 == local_a4) {
    WVar11 = WJTL_STATUS_SUCCESS;
  }
  if (sVar2 != 0) {
    WVar11 = WJTL_STATUS_FAILED;
  }
  if (JVar4 != JL_DATA_TYPE_LIST) {
    WVar11 = WJTL_STATUS_FAILED;
  }
  if (pJVar1 == (JlDataObject *)0x0) {
    WVar11 = WJTL_STATUS_FAILED;
  }
  if (JVar3 != JL_STATUS_SUCCESS) {
    WVar11 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(uVar5 == local_a4,"JlGetListCount( listObject ) == ListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fe);
  local_78 = (JlListItem *)0x0;
  if (uVar10 != 0) {
    local_70 = (ulong)-local_a8;
    uVar8 = 0;
    uVar10 = 0;
    do {
      uVar5 = local_a8;
      local_b0 = (JlDataObject *)0x0;
      local_8c = uVar10;
      local_88 = uVar8;
      JVar3 = JlGetObjectListNextItem(local_98,&local_b0,&local_78);
      WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x304);
      pJVar1 = local_b0;
      WjTestLib_Assert(local_b0 != (JlDataObject *)0x0,"(dictionaryObject) != NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x305);
      JVar4 = JlGetObjectType(local_b0);
      if (JVar4 != JL_DATA_TYPE_DICTIONARY) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (pJVar1 == (JlDataObject *)0x0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (JVar3 != JL_STATUS_SUCCESS) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(JVar4 == JL_DATA_TYPE_DICTIONARY,
                       "JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x306);
      if (uVar5 != 0) {
        iVar9 = 1;
        do {
          local_a0 = (JlDataObject *)0x0;
          local_80 = 0;
          local_68 = (ulong)(uint)((int)local_88 + iVar9);
          local_58[0x10] = '\0';
          local_58[0x11] = '\0';
          local_58[0x12] = '\0';
          local_58[0x13] = '\0';
          local_58[0x14] = '\0';
          local_58[0x15] = '\0';
          local_58[0x16] = '\0';
          local_58[0x17] = '\0';
          local_58[0x18] = '\0';
          local_58[0x19] = '\0';
          local_58[0x1a] = '\0';
          local_58[0x1b] = '\0';
          local_58[0x1c] = '\0';
          local_58[0x1d] = '\0';
          local_58[0x1e] = '\0';
          local_58[0x1f] = '\0';
          local_58[0] = '\0';
          local_58[1] = '\0';
          local_58[2] = '\0';
          local_58[3] = '\0';
          local_58[4] = '\0';
          local_58[5] = '\0';
          local_58[6] = '\0';
          local_58[7] = '\0';
          local_58[8] = '\0';
          local_58[9] = '\0';
          local_58[10] = '\0';
          local_58[0xb] = '\0';
          local_58[0xc] = '\0';
          local_58[0xd] = '\0';
          local_58[0xe] = '\0';
          local_58[0xf] = '\0';
          sprintf(local_58,"num%u");
          JVar3 = JlGetObjectFromDictionaryByKey(local_b0,local_58,&local_a0);
          WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                           "((JL_STATUS)(JlGetObjectFromDictionaryByKey( dictionaryObject, keyName, &object ))) == (JL_STATUS_SUCCESS)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x311);
          pJVar1 = local_a0;
          WjTestLib_Assert(local_a0 != (JlDataObject *)0x0,"(object) != NULL",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x312);
          JVar4 = JlGetObjectType(local_a0);
          WjTestLib_Assert(JVar4 == JL_DATA_TYPE_NUMBER,
                           "JlGetObjectType( object ) == JL_DATA_TYPE_NUMBER",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x313);
          JVar6 = JlGetObjectNumberU64(local_a0,&local_80);
          WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                           "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x314);
          if (local_80 != local_68) {
            WVar11 = WJTL_STATUS_FAILED;
          }
          if (JVar6 != JL_STATUS_SUCCESS) {
            WVar11 = WJTL_STATUS_FAILED;
          }
          if (JVar4 != JL_DATA_TYPE_NUMBER) {
            WVar11 = WJTL_STATUS_FAILED;
          }
          if (pJVar1 == (JlDataObject *)0x0) {
            WVar11 = WJTL_STATUS_FAILED;
          }
          if (JVar3 != JL_STATUS_SUCCESS) {
            WVar11 = WJTL_STATUS_FAILED;
          }
          WjTestLib_Assert(local_80 == local_68,"u64 == (uint64_t)counter",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x315);
          iVar7 = (int)local_70 + iVar9;
          iVar9 = iVar9 + 1;
        } while (iVar7 != 0);
      }
      uVar10 = local_8c + 1;
      uVar8 = (ulong)((int)local_88 + local_a8);
    } while (uVar10 != local_a4);
  }
  JVar3 = JlGetObjectListNextItem(local_98,&local_b0,&local_78);
  WjTestLib_Assert(JVar3 == JL_STATUS_END_OF_DATA,
                   "(JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x31a);
  JVar6 = JlFreeObjectTree(&local_98);
  if (JVar6 != JL_STATUS_SUCCESS) {
    WVar11 = WJTL_STATUS_FAILED;
  }
  if (JVar3 != JL_STATUS_END_OF_DATA) {
    WVar11 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x31d);
  return WVar11;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfDictionariesOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        uint32_t        ListCount,
        uint32_t        DictionaryCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   dictionaryObject = NULL;
    uint32_t        counter = 0;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( listObject );
    JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
    JL_ASSERT( errorAtPos == 0 );

    JL_ASSERT( JlGetListCount( listObject ) == ListCount );

    enumerator = NULL;
    for( uint32_t i=0; i<ListCount; i++ )
    {
        dictionaryObject = NULL;
        JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ) );
        JL_ASSERT_NOT_NULL( dictionaryObject );
        JL_ASSERT( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY );

        for( uint32_t x=0; x<DictionaryCount; x++ )
        {
            JlDataObject* object = NULL;
            uint64_t u64 = 0;

            counter += 1;
            char keyName [32] = {0};
            sprintf( keyName, "num%u", counter );

            JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( dictionaryObject, keyName, &object ) );
            JL_ASSERT_NOT_NULL( object );
            JL_ASSERT( JlGetObjectType( object ) == JL_DATA_TYPE_NUMBER );
            JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
            JL_ASSERT( u64 == (uint64_t)counter );
        }
    }

    // Verify there are no more items in the list
    JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ), JL_STATUS_END_OF_DATA );

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );

    return TestReturn;
}